

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

bool helics::iteratingTimeGrantCheck
               (DependencyInfo *dep,Time desiredGrantTime,GrantDelayMode delayMode)

{
  bool bVar1;
  char in_DL;
  TimeRepresentation<count_time<9,_long>_> *in_RDI;
  TimeRepresentation<count_time<9,_long>_> local_10;
  bool local_1;
  
  if (((in_RDI[9].internalTimeCode & 0x100000000000000) == 0) ||
     (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=
                        (in_RDI,(TimeRepresentation<count_time<9,_long>_> *)&cBigTime), bVar1)) {
    local_1 = true;
  }
  else if (*(char *)((long)&in_RDI[9].internalTimeCode + 5) == '\x03') {
    local_1 = true;
  }
  else {
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(in_RDI,&local_10);
    if (bVar1) {
      local_1 = false;
    }
    else {
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(in_RDI,&local_10);
      if ((bVar1) && ((char)in_RDI[6].internalTimeCode == '\x05')) {
        local_1 = false;
      }
      else if ((in_DL == '\x02') &&
              ((((char)in_RDI[6].internalTimeCode == '\a' ||
                ((char)in_RDI[6].internalTimeCode == '\x06')) &&
               (*(int *)((long)&in_RDI[7].internalTimeCode + 4) <
                *(int *)((long)&in_RDI[8].internalTimeCode + 4))))) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

static bool iteratingTimeGrantCheck(const DependencyInfo& dep,
                                    Time desiredGrantTime,
                                    GrantDelayMode delayMode)
{
    if (!dep.dependency || dep.next >= cBigTime) {
        return true;
    }
    if (dep.connection == ConnectionType::SELF) {
        return true;
    }
    if (dep.next < desiredGrantTime) {
        return false;
    }
    if ((dep.next == desiredGrantTime) && (dep.mTimeState == TimeState::time_granted)) {
        return false;
    }
    if (delayMode == GrantDelayMode::WAITING) {
        if (dep.mTimeState == TimeState::time_requested_iterative ||
            dep.mTimeState == TimeState::time_requested_require_iteration) {
            if (dep.sequenceCounter < dep.grantedIteration) {
                return false;
            }
        }
    }
    return true;
}